

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec.c
# Opt level: O2

void TransformDC_C(int16_t *in,uint8_t *dst)

{
  short sVar1;
  long lVar2;
  long lVar3;
  uint8_t uVar4;
  int iVar5;
  
  sVar1 = *in;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      iVar5 = (uint)dst[lVar3] + (sVar1 + 4 >> 3);
      if (iVar5 < 1) {
        iVar5 = 0;
      }
      uVar4 = (uint8_t)iVar5;
      if (0xfe < iVar5) {
        uVar4 = 0xff;
      }
      dst[lVar3] = uVar4;
    }
    dst = dst + 0x20;
  }
  return;
}

Assistant:

static void TransformDC_C(const int16_t* WEBP_RESTRICT in,
                          uint8_t* WEBP_RESTRICT dst) {
  const int DC = in[0] + 4;
  int i, j;
  for (j = 0; j < 4; ++j) {
    for (i = 0; i < 4; ++i) {
      STORE(i, j, DC);
    }
  }
}